

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O0

void GenAssn(void)

{
  tokentype tVar1;
  datatype dVar2;
  datatype dVar3;
  addressrec a;
  addressrec local_20;
  addressrec op3;
  addressrec op2;
  addressrec op1;
  
  tVar1 = actionpop();
  op3 = getaddress(tVar1);
  tVar1 = actionpop();
  a = getaddress(tVar1);
  op2.opnd = a.opnd;
  dVar2 = data_class(op2.opnd);
  dVar3 = data_class(op3.opnd);
  if (dVar2 == dVar3) {
    nextop = genquad(opassn,a,op3,(addressrec)0x4);
  }
  else {
    dVar2 = data_class(op2.opnd);
    if (dVar2 == dtreal) {
      nextop = genfuncall(&local_20,op3);
      didcalculation = 1;
      nextop = genquad(opassn,a,local_20,(addressrec)0x4);
    }
    else {
      printf("%d\t%d",(ulong)a & 0xffffffff,(ulong)op3 & 0xffffffff);
      error("Assigning a value to an incompatible type",linenum);
    }
  }
  if (didcalculation != 0) {
    permtarget(a);
  }
  didcalculation = 0;
  return;
}

Assistant:

void GenAssn(void)
{
    struct addressrec	op1, op2, op3;
    op2 = getaddress(actionpop());
    op1 = getaddress(actionpop());
    
    if (data_class(op1.opnd) == data_class(op2.opnd))
        nextop = genquad(opassn, op1, op2, no_op);
    else if (data_class(op1.opnd) == dtreal)	{
        nextop = genfuncall(&op3, op2);
        
        didcalculation = YES;
        nextop = genquad(opassn, op1, op3, no_op);
    }
    else	{
        printf("%d\t%d", op1.opndtype, op2.opndtype);
        error("Assigning a value to an incompatible type",
              linenum);
    }
    
    if (didcalculation)
        permtarget(op1);
    didcalculation = NO;
}